

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_spurious_unsub_does_not_affect_subscriptions_Test::TestBody
          (SubjectSetRegisterTest_test_spurious_unsub_does_not_affect_subscriptions_Test *this)

{
  char *in_R9;
  AssertHelper local_130;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  AssertionResult gtest_ar_;
  _Storage<bidfx_public_api::price::pixie::SubscriptionSync,_false> local_110;
  byte local_a8;
  SubjectSetRegister subject_register;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(&subject_register);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  gtest_ar_.success_ = (bool)(local_a8 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
             &local_110._M_value);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_110._M_value,(internal *)&gtest_ar_,
               (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x33a,(char *)local_110._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register);
    bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
    gtest_ar_.success_ = (bool)(local_a8 ^ 1);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
              ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
               &local_110._M_value);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_110._M_value,(internal *)&gtest_ar_,
                 (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                 ,0x33d,(char *)local_110._0_8_);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register);
      bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
      gtest_ar_.success_ = (bool)(local_a8 ^ 1);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
                ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
                 &local_110._M_value);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_110._M_value,(internal *)&gtest_ar_,
                   (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                   ,0x340,(char *)local_110._0_8_);
        testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register)
        ;
        bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
        gtest_ar_.success_ = (bool)(local_a8 ^ 1);
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
                  ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
                   &local_110._M_value);
        if (local_a8 == 0) goto LAB_001a9e12;
        testing::Message::Message((Message *)&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_110._M_value,(internal *)&gtest_ar_,
                   (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                   ,0x343,(char *)local_110._0_8_);
        testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_128);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_130);
  std::__cxx11::string::~string((string *)&local_110._M_value);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_128);
LAB_001a9e12:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  SubjectSetRegister::~SubjectSetRegister(&subject_register);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_spurious_unsub_does_not_affect_subscriptions)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Unregister(SS_SUBJECT0);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Unregister(SS_SUBJECT0);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Unregister(SS_SUBJECT0);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Unregister(SS_SUBJECT1);
    ASSERT_FALSE(subject_register.NextSubscriptionSync());
}